

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::MarkAsIgnored::MarkAsIgnored(MarkAsIgnored *this,char *test_suite)

{
  value_type *in_RSI;
  allocator<char> *__a;
  char *in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffb0;
  undefined7 in_stack_ffffffffffffffb1;
  allocator<char> local_31;
  string local_30 [32];
  value_type *local_10;
  
  local_10 = in_RSI;
  GetIgnoredParameterizedTestSuites_abi_cxx11_();
  __a = &local_31;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT71(in_stack_ffffffffffffffb1,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffa8
             ,__a);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)__a,local_10);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator(&local_31);
  return;
}

Assistant:

MarkAsIgnored::MarkAsIgnored(const char* test_suite) {
  GetIgnoredParameterizedTestSuites()->insert(test_suite);
}